

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O2

uchar * __thiscall loser_tree<unsigned_char_*>::min(loser_tree<unsigned_char_*> *this)

{
  size_t *psVar1;
  uchar **ppuVar2;
  uchar *puVar3;
  Stream *pSVar4;
  
  if (this->_nonempty_streams == 0) {
    __assert_fail("_nonempty_streams",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/losertree.h"
                  ,0x9d,"T loser_tree<unsigned char *>::min() [T = unsigned char *]");
  }
  pSVar4 = node2stream(this,0);
  if (pSVar4->n != 0) {
    pSVar4 = node2stream(this,0);
    ppuVar2 = pSVar4->stream;
    pSVar4->stream = ppuVar2 + 1;
    puVar3 = *ppuVar2;
    pSVar4 = node2stream(this,0);
    psVar1 = &pSVar4->n;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      this->_nonempty_streams = this->_nonempty_streams - 1;
    }
    update(this);
    return puVar3;
  }
  __assert_fail("not stream_empty(node2stream(0))",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/losertree.h"
                ,0x9e,"T loser_tree<unsigned char *>::min() [T = unsigned char *]");
}

Assistant:

T min()
	{
		//debug() << __PRETTY_FUNCTION__ << std::endl;
		assert(_nonempty_streams);
		assert(not stream_empty(node2stream(0)));
		T ret = *(node2stream(0).stream++);
		if (--node2stream(0).n == size_t(0)) { --_nonempty_streams; }
		update();
		//debug() << "\t -> " << ret << std::endl;
		return ret;
	}